

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_py_generator.cc
# Opt level: O1

void __thiscall t_py_generator::init_generator(t_py_generator *this)

{
  string *this_00;
  ofstream_with_content_based_conditional_update *this_01;
  bool gen_twisted;
  t_program *program;
  pointer pcVar1;
  t_py_generator *ptVar2;
  t_py_generator *this_02;
  size_type sVar3;
  int iVar4;
  int *piVar5;
  long lVar6;
  long *plVar7;
  undefined4 extraout_var;
  ostream *poVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  char *__rhs;
  long *plVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  pointer pptVar11;
  _Alloc_hider _Var12;
  string f_types_name;
  string module;
  string f_init_name;
  string f_consts_name;
  vector<t_service_*,_std::allocator<t_service_*>_> services;
  ofstream_with_content_based_conditional_update f_init;
  long *local_358;
  long local_350;
  long local_348;
  long lStack_340;
  string local_338;
  t_py_generator *local_318;
  undefined8 local_310;
  string local_308;
  string local_2e8;
  char *local_2c8 [2];
  char local_2b8 [16];
  long *local_2a8;
  long local_2a0;
  long local_298;
  long lStack_290;
  vector<t_service_*,_std::allocator<t_service_*>_> local_288;
  string local_270;
  string local_250;
  undefined1 local_230 [8];
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220 [6];
  string local_1c0 [32];
  undefined1 local_1a0;
  ios_base local_198 [96];
  ios_base local_138 [264];
  
  program = (this->super_t_generator).program_;
  gen_twisted = this->gen_twisted_;
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"");
  get_real_py_module(&local_308,program,gen_twisted,&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  (*(this->super_t_generator)._vptr_t_generator[0x1b])(local_230,this);
  this_00 = &this->package_dir_;
  std::__cxx11::string::operator=((string *)this_00,(string *)local_230);
  if (local_230 != (undefined1  [8])local_220) {
    operator_delete((void *)local_230);
  }
  local_318 = this;
  std::__cxx11::string::_M_assign((string *)&this->module_);
  paVar10 = _VTT;
  local_310 = _PyCFunction_Type;
  while( true ) {
    iVar4 = mkdir((this_00->_M_dataplus)._M_p,0x1ff);
    if ((iVar4 == -1) && (piVar5 = __errno_location(), *piVar5 != 0x11)) {
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      std::__cxx11::string::string
                ((string *)&local_358,(this_00->_M_dataplus)._M_p,(allocator *)&local_2a8);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_358);
      local_230 = (undefined1  [8])*plVar7;
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar7 + 2);
      if (local_230 == (undefined1  [8])paVar10) {
        local_220[0]._0_8_ = paVar10->_M_allocated_capacity;
        local_220[0]._8_8_ = plVar7[3];
        local_230 = (undefined1  [8])local_220;
      }
      else {
        local_220[0]._0_8_ = paVar10->_M_allocated_capacity;
      }
      local_228 = plVar7[1];
      *plVar7 = (long)paVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      __rhs = strerror(*piVar5);
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230,
                     __rhs);
      __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
    local_358 = &local_348;
    pcVar1 = (local_318->package_dir_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_358,pcVar1,pcVar1 + (local_318->package_dir_)._M_string_length);
    std::__cxx11::string::append((char *)&local_358);
    std::ofstream::ofstream(local_230,(char *)local_358,_S_app);
    if (local_358 != &local_348) {
      operator_delete(local_358);
    }
    std::ofstream::close();
    sVar3 = local_308._M_string_length;
    if (local_308._M_string_length == 0) break;
    lVar6 = std::__cxx11::string::find((char)&local_308,0x2e);
    if (lVar6 == -1) {
      std::__cxx11::string::append((char *)this_00);
      std::__cxx11::string::_M_append((char *)this_00,(ulong)local_308._M_dataplus._M_p);
      local_308._M_string_length = 0;
      *local_308._M_dataplus._M_p = '\0';
    }
    else {
      std::__cxx11::string::append((char *)this_00);
      std::__cxx11::string::substr((ulong)&local_358,(ulong)&local_308);
      std::__cxx11::string::_M_append((char *)this_00,(ulong)local_358);
      if (local_358 != &local_348) {
        operator_delete(local_358);
      }
      std::__cxx11::string::erase((ulong)&local_308,0);
    }
    local_230 = (undefined1  [8])paVar10;
    *(undefined8 *)(local_230 + (&paVar10->_M_allocated_capacity)[-3]) = local_310;
    std::filebuf::~filebuf((filebuf *)&local_228);
    std::ios_base::~ios_base(local_138);
    if (sVar3 == 0) {
LAB_0030d025:
      ptVar2 = local_318;
      pcVar1 = (local_318->package_dir_)._M_dataplus._M_p;
      local_230 = (undefined1  [8])local_220;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_230,pcVar1,pcVar1 + (local_318->package_dir_)._M_string_length);
      std::__cxx11::string::append(local_230);
      plVar7 = (long *)std::__cxx11::string::append(local_230);
      local_358 = &local_348;
      plVar9 = plVar7 + 2;
      if ((long *)*plVar7 == plVar9) {
        local_348 = *plVar9;
        lStack_340 = plVar7[3];
      }
      else {
        local_348 = *plVar9;
        local_358 = (long *)*plVar7;
      }
      local_350 = plVar7[1];
      *plVar7 = (long)plVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if (local_230 != (undefined1  [8])local_220) {
        operator_delete((void *)local_230);
      }
      std::__cxx11::string::string((string *)local_230,(char *)local_358,(allocator *)&local_2a8);
      std::__cxx11::string::_M_assign
                ((string *)
                 &(ptVar2->f_types_).super_ostringstream.
                  super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
      this_01 = &ptVar2->f_types_;
      template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
      clear_buf(this_01);
      (ptVar2->f_types_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
      field_0x90 = 0;
      if (local_230 != (undefined1  [8])local_220) {
        operator_delete((void *)local_230);
      }
      pcVar1 = (ptVar2->package_dir_)._M_dataplus._M_p;
      local_230 = (undefined1  [8])local_220;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_230,pcVar1,pcVar1 + (ptVar2->package_dir_)._M_string_length);
      std::__cxx11::string::append(local_230);
      plVar7 = (long *)std::__cxx11::string::append(local_230);
      local_2a8 = &local_298;
      plVar9 = plVar7 + 2;
      if ((long *)*plVar7 == plVar9) {
        local_298 = *plVar9;
        lStack_290 = plVar7[3];
      }
      else {
        local_298 = *plVar9;
        local_2a8 = (long *)*plVar7;
      }
      local_2a0 = plVar7[1];
      *plVar7 = (long)plVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if (local_230 != (undefined1  [8])local_220) {
        operator_delete((void *)local_230);
      }
      std::__cxx11::string::string((string *)local_230,(char *)local_2a8,(allocator *)local_2c8);
      std::__cxx11::string::_M_assign
                ((string *)
                 &(ptVar2->f_consts_).super_ostringstream.
                  super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
      template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
      clear_buf(&ptVar2->f_consts_);
      (ptVar2->f_consts_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
      field_0x90 = 0;
      if (local_230 != (undefined1  [8])local_220) {
        operator_delete((void *)local_230);
      }
      local_2c8[0] = local_2b8;
      pcVar1 = (ptVar2->package_dir_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2c8,pcVar1,pcVar1 + (ptVar2->package_dir_)._M_string_length);
      std::__cxx11::string::append((char *)local_2c8);
      template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
      template_ofstream_with_content_based_conditional_update
                ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
                  *)local_230);
      std::__cxx11::string::string((string *)&local_338,local_2c8[0],(allocator *)&local_2e8);
      std::__cxx11::string::_M_assign(local_1c0);
      template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
      clear_buf((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
                 *)local_230);
      local_1a0 = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_230,"__all__ = [\'ttypes\', \'constants\'",0x20);
      std::vector<t_service_*,_std::allocator<t_service_*>_>::vector
                (&local_288,&((ptVar2->super_t_generator).program_)->services_);
      if (local_288.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_288.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pptVar11 = local_288.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,", \'",3);
          iVar4 = (*((*pptVar11)->super_t_type).super_t_doc._vptr_t_doc[3])();
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_230,*(char **)CONCAT44(extraout_var,iVar4),
                              ((undefined8 *)CONCAT44(extraout_var,iVar4))[1]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\'",1);
          pptVar11 = pptVar11 + 1;
        } while (pptVar11 !=
                 local_288.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"]",1);
      this_02 = local_318;
      _Var12 = ::endl_abi_cxx11_._M_dataplus;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_230,::endl_abi_cxx11_._M_dataplus._M_p,
                 ::endl_abi_cxx11_._M_string_length);
      template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
                ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
                  *)local_230,(int)_Var12._M_p);
      py_autogen_comment_abi_cxx11_(&local_338,this_02);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)this_01,local_338._M_dataplus._M_p,local_338._M_string_length);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      py_imports_abi_cxx11_(&local_2e8,this_02);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_2e8._M_dataplus._M_p,local_2e8._M_string_length);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      render_includes_abi_cxx11_(&local_270,this_02);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_270._M_dataplus._M_p,local_270._M_string_length);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"from thrift.transport import TTransport",0x27);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,(this_02->import_dynbase_)._M_dataplus._M_p,
                 (this_02->import_dynbase_)._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
        operator_delete(local_2e8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"all_structs = []",0x10)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_01,::endl_abi_cxx11_._M_dataplus._M_p,
                 ::endl_abi_cxx11_._M_string_length);
      py_autogen_comment_abi_cxx11_(&local_338,this_02);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&ptVar2->f_consts_,local_338._M_dataplus._M_p,
                          local_338._M_string_length);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      py_imports_abi_cxx11_(&local_2e8,this_02);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_2e8._M_dataplus._M_p,local_2e8._M_string_length);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"from .ttypes import *",0x15);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
        operator_delete(local_2e8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p);
      }
      if (local_288.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_288.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
      ~template_ofstream_with_content_based_conditional_update
                ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
                  *)local_230,
                 &template_ofstream_with_content_based_conditional_update<char,std::char_traits<char>>
                  ::VTT);
      std::ios_base::~ios_base(local_198);
      if (local_2c8[0] != local_2b8) {
        operator_delete(local_2c8[0]);
      }
      if (local_2a8 != &local_298) {
        operator_delete(local_2a8);
      }
      if (local_358 != &local_348) {
        operator_delete(local_358);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
        operator_delete(local_308._M_dataplus._M_p);
      }
      return;
    }
  }
  local_230 = (undefined1  [8])paVar10;
  *(undefined8 *)(local_230 + (&paVar10->_M_allocated_capacity)[-3]) = local_310;
  std::filebuf::~filebuf((filebuf *)&local_228);
  std::ios_base::~ios_base(local_138);
  goto LAB_0030d025;
}

Assistant:

void t_py_generator::init_generator() {
  // Make output directory
  string module = get_real_py_module(program_, gen_twisted_);
  package_dir_ = get_out_dir();
  module_ = module;
  while (true) {
    // TODO: Do better error checking here.
    MKDIR(package_dir_.c_str());
    std::ofstream init_py((package_dir_ + "/__init__.py").c_str(), std::ios_base::app);
    init_py.close();
    if (module.empty()) {
      break;
    }
    string::size_type pos = module.find('.');
    if (pos == string::npos) {
      package_dir_ += "/";
      package_dir_ += module;
      module.clear();
    } else {
      package_dir_ += "/";
      package_dir_ += module.substr(0, pos);
      module.erase(0, pos + 1);
    }
  }

  // Make output file
  string f_types_name = package_dir_ + "/" + "ttypes.py";
  f_types_.open(f_types_name.c_str());

  string f_consts_name = package_dir_ + "/" + "constants.py";
  f_consts_.open(f_consts_name.c_str());

  string f_init_name = package_dir_ + "/__init__.py";
  ofstream_with_content_based_conditional_update f_init;
  f_init.open(f_init_name.c_str());
  f_init << "__all__ = ['ttypes', 'constants'";
  vector<t_service*> services = program_->get_services();
  vector<t_service*>::iterator sv_iter;
  for (sv_iter = services.begin(); sv_iter != services.end(); ++sv_iter) {
    f_init << ", '" << (*sv_iter)->get_name() << "'";
  }
  f_init << "]" << endl;
  f_init.close();

  // Print header
  f_types_ << py_autogen_comment() << endl
           << py_imports() << endl
           << render_includes() << endl
           << "from thrift.transport import TTransport" << endl
           << import_dynbase_;

  f_types_ << "all_structs = []" << endl;

  f_consts_ <<
    py_autogen_comment() << endl <<
    py_imports() << endl <<
    "from .ttypes import *" << endl;
}